

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForbiddenPointFinder.cpp
# Opt level: O2

void __thiscall ForbiddenPointFinder::clear(ForbiddenPointFinder *this)

{
  Stone *pSVar1;
  long lVar2;
  long lVar3;
  
  this->nForbiddenPoints = 0;
  pSVar1 = this->cBoard[0] + 0x10;
  for (lVar2 = 0; lVar2 != 0x11; lVar2 = lVar2 + 1) {
    this->cBoard[0][lVar2] = Wall;
    this->cBoard[0x10][lVar2] = Wall;
    (*(Stone (*) [17])(pSVar1 + -0x10))[0] = Wall;
    *pSVar1 = Wall;
    pSVar1 = pSVar1 + 0x11;
  }
  pSVar1 = this->cBoard[1] + 1;
  for (lVar2 = 1; lVar2 != 0x10; lVar2 = lVar2 + 1) {
    for (lVar3 = 0; lVar3 != 0xf; lVar3 = lVar3 + 1) {
      pSVar1[lVar3] = Empty;
    }
    pSVar1 = pSVar1 + 0x11;
  }
  return;
}

Assistant:

void ForbiddenPointFinder::clear() {
    nForbiddenPoints = 0;

    for (int i = 0; i < BoardSize + 2; i++) {
        cBoard[0][i] = Stone ::Wall;
        cBoard[(BoardSize + 1)][i] = Stone ::Wall;
        cBoard[i][0] = Stone ::Wall;
        cBoard[i][(BoardSize + 1)] = Stone ::Wall;
    }

    for (int i = 1; i <= BoardSize; i++)
        for (int j = 1; j <= BoardSize; j++)
            cBoard[i][j] = Stone::Empty;
}